

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3ResultSetOfSelect(Parse *pParse,Select *pSelect)

{
  int iVar1;
  sqlite3 *db_00;
  int savedFlags;
  sqlite3 *db;
  Table *pTab;
  Select *pSelect_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  iVar1 = db_00->flags;
  db_00->flags = db_00->flags & 0xfffffffb;
  db_00->flags = db_00->flags | 8;
  sqlite3SelectPrep(pParse,pSelect,(NameContext *)0x0);
  pTab = (Table *)pSelect;
  if (pParse->nErr == 0) {
    for (; pTab->azModuleArg != (char **)0x0; pTab = (Table *)pTab->azModuleArg) {
    }
    db_00->flags = iVar1;
    pParse_local = (Parse *)sqlite3DbMallocZero(db_00,0x78);
    if (pParse_local == (Parse *)0x0) {
      pParse_local = (Parse *)0x0;
    }
    else {
      *(u16 *)((long)pParse_local->aTempReg + 0x1c) = 1;
      pParse_local->db = (sqlite3 *)0x0;
      *(tRowcnt *)((long)pParse_local->aTempReg + 0x10) = 1000000;
      selectColumnsFromExprList
                (pParse,(ExprList *)pTab->zName,(i16 *)((long)pParse_local->aTempReg + 0x1a),
                 (Column **)&pParse_local->zErrMsg);
      selectAddColumnTypeAndCollation
                (pParse,(int)*(i16 *)((long)pParse_local->aTempReg + 0x1a),
                 (Column *)pParse_local->zErrMsg,(Select *)pTab);
      *(i16 *)((long)pParse_local->aTempReg + 0x18) = -1;
      if (db_00->mallocFailed != '\0') {
        sqlite3DeleteTable(db_00,(Table *)pParse_local);
        pParse_local = (Parse *)0x0;
      }
    }
  }
  else {
    pParse_local = (Parse *)0x0;
  }
  return (Table *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3ResultSetOfSelect(Parse *pParse, Select *pSelect){
  Table *pTab;
  sqlite3 *db = pParse->db;
  int savedFlags;

  savedFlags = db->flags;
  db->flags &= ~SQLITE_FullColNames;
  db->flags |= SQLITE_ShortColNames;
  sqlite3SelectPrep(pParse, pSelect, 0);
  if( pParse->nErr ) return 0;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  db->flags = savedFlags;
  pTab = sqlite3DbMallocZero(db, sizeof(Table) );
  if( pTab==0 ){
    return 0;
  }
  /* The sqlite3ResultSetOfSelect() is only used n contexts where lookaside
  ** is disabled */
  assert( db->lookaside.bEnabled==0 );
  pTab->nRef = 1;
  pTab->zName = 0;
  pTab->nRowEst = 1000000;
  selectColumnsFromExprList(pParse, pSelect->pEList, &pTab->nCol, &pTab->aCol);
  selectAddColumnTypeAndCollation(pParse, pTab->nCol, pTab->aCol, pSelect);
  pTab->iPKey = -1;
  if( db->mallocFailed ){
    sqlite3DeleteTable(db, pTab);
    return 0;
  }
  return pTab;
}